

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O2

_Bool cf_h2_proxy_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  
  pvVar1 = cf->ctx;
  if (pvVar1 != (void *)0x0) {
    _Var3 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x10));
    if (!_Var3) {
      return true;
    }
    if ((*(int *)((long)pvVar1 + 0x130) == 3) &&
       (_Var3 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x98)), !_Var3)) {
      return true;
    }
  }
  pCVar2 = cf->next;
  if (pCVar2 == (Curl_cfilter *)0x0) {
    return false;
  }
  _Var3 = (*pCVar2->cft->has_data_pending)(pCVar2,data);
  return _Var3;
}

Assistant:

static bool cf_h2_proxy_data_pending(struct Curl_cfilter *cf,
                                     const struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  if((ctx && !Curl_bufq_is_empty(&ctx->inbufq)) ||
     (ctx && ctx->tunnel.state == H2_TUNNEL_ESTABLISHED &&
      !Curl_bufq_is_empty(&ctx->tunnel.recvbuf)))
    return TRUE;
  return cf->next? cf->next->cft->has_data_pending(cf->next, data) : FALSE;
}